

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O3

Vec_Int_t * Rnm_ManFilterSelected(Rnm_Man_t *p,Vec_Int_t *vOldPPis)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  Vec_Int_t *p_00;
  int *piVar12;
  size_t sVar13;
  Vec_Int_t *pVVar14;
  int iVar15;
  long lVar16;
  size_t __nmemb;
  long lVar17;
  
  p->vFanins->nSize = 0;
  uVar11 = (ulong)(uint)vOldPPis->nSize;
  if (vOldPPis->nSize < 1) {
    bVar8 = false;
  }
  else {
    lVar17 = 0;
    do {
      iVar9 = (int)uVar11;
      iVar15 = vOldPPis->pArray[lVar17];
      if (((long)iVar15 < 0) || (pGVar4 = p->pGia, pGVar4->nObjs <= iVar15)) goto LAB_0057bbf5;
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      Ga2_ObjLeaves(pGVar4,pGVar4->pObjs + iVar15);
      if (0 < Ga2_ObjLeaves_v_0) {
        lVar16 = 0;
        do {
          iVar15 = *(int *)(Ga2_ObjLeaves_v_1 + lVar16 * 4);
          lVar10 = (long)iVar15;
          if ((lVar10 < 0) || (p->pGia->nObjs <= iVar15)) goto LAB_0057bbf5;
          pGVar5 = p->pGia->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          if (p->vCounts->nSize <= iVar15) goto LAB_0057bc14;
          pcVar6 = p->vCounts->pArray;
          cVar1 = pcVar6[lVar10];
          if ((cVar1 < '\x10') && (pcVar6[lVar10] = cVar1 + '\x01', cVar1 == '\0')) {
            pGVar5 = pGVar5 + lVar10;
            pGVar7 = p->pGia->pObjs;
            if ((pGVar5 < pGVar7) || (pGVar7 + p->pGia->nObjs <= pGVar5)) goto LAB_0057bc33;
            Vec_IntPush(p->vFanins,(int)((ulong)((long)pGVar5 - (long)pGVar7) >> 2) * -0x55555555);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < Ga2_ObjLeaves_v_0);
      }
      lVar17 = lVar17 + 1;
      iVar9 = vOldPPis->nSize;
      uVar11 = (ulong)iVar9;
    } while (lVar17 < (long)uVar11);
    bVar8 = 0 < iVar9;
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar12 = (int *)malloc(400);
  p_00->pArray = piVar12;
  if (bVar8) {
    lVar17 = 0;
    do {
      iVar15 = vOldPPis->pArray[lVar17];
      if (((long)iVar15 < 0) || (pGVar4 = p->pGia, pGVar4->nObjs <= iVar15)) goto LAB_0057bbf5;
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = pGVar4->pObjs + iVar15;
      if (((~(uint)*(undefined8 *)pGVar5 & 0x9fffffff) == 0) &&
         (pGVar4->vCis->nSize - pGVar4->nRegs <=
          (int)((uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) & 0x1fffffff))) {
LAB_0057bb26:
        Vec_IntPush(p_00,iVar15);
      }
      else {
        Ga2_ObjLeaves(pGVar4,pGVar5);
        if (0 < (long)Ga2_ObjLeaves_v_0) {
          lVar16 = 0;
          do {
            iVar15 = *(int *)(Ga2_ObjLeaves_v_1 + lVar16 * 4);
            lVar10 = (long)iVar15;
            if ((lVar10 < 0) || (uVar2 = p->pGia->nObjs, (int)uVar2 <= iVar15)) goto LAB_0057bbf5;
            pGVar7 = p->pGia->pObjs;
            if (pGVar7 == (Gia_Obj_t *)0x0) break;
            if ((~*(ulong *)(pGVar7 + lVar10) & 0x1fffffff1fffffff) == 0) {
LAB_0057bafe:
              if ((pGVar5 < pGVar7) || (pGVar7 + uVar2 <= pGVar5)) {
LAB_0057bc33:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              iVar15 = (int)((ulong)((long)pGVar5 - (long)pGVar7) >> 2) * -0x55555555;
              goto LAB_0057bb26;
            }
            uVar3 = pGVar7[lVar10].Value;
            if ((ulong)uVar3 != 0) {
              if (p->nObjsFrame <= (int)uVar3) {
                __assert_fail("(int)pObj->Value < p->nObjsFrame",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                              ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
              }
              if (p->pCex->iFrame < 0) {
                __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                              ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
              }
              if (((uint)p->pObjs[uVar3] & 4) != 0) goto LAB_0057bafe;
            }
            if (p->vCounts->nSize <= iVar15) {
LAB_0057bc14:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            if ('\x01' < p->vCounts->pArray[lVar10]) goto LAB_0057bafe;
            lVar16 = lVar16 + 1;
          } while (Ga2_ObjLeaves_v_0 != lVar16);
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < vOldPPis->nSize);
    iVar15 = p_00->nSize;
    __nmemb = (size_t)iVar15;
    if (1 < (long)__nmemb) {
      piVar12 = p_00->pArray;
      qsort(piVar12,__nmemb,4,Vec_IntSortCompare1);
      iVar9 = 1;
      sVar13 = 1;
      do {
        if (piVar12[sVar13] != piVar12[sVar13 - 1]) {
          lVar17 = (long)iVar9;
          iVar9 = iVar9 + 1;
          piVar12[lVar17] = piVar12[sVar13];
        }
        sVar13 = sVar13 + 1;
      } while (__nmemb != sVar13);
      p_00->nSize = iVar9;
      if (iVar15 != iVar9) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRefSelect.c"
                      ,0xb2,"Vec_Int_t *Rnm_ManFilterSelected(Rnm_Man_t *, Vec_Int_t *)");
      }
    }
  }
  pVVar14 = p->vFanins;
  if (0 < pVVar14->nSize) {
    lVar17 = 0;
    do {
      iVar15 = pVVar14->pArray[lVar17];
      if (((long)iVar15 < 0) || (p->pGia->nObjs <= iVar15)) {
LAB_0057bbf5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pGia->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      if (p->vCounts->nSize <= iVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      p->vCounts->pArray[iVar15] = '\0';
      lVar17 = lVar17 + 1;
      pVVar14 = p->vFanins;
    } while (lVar17 < pVVar14->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Rnm_ManFilterSelected( Rnm_Man_t * p, Vec_Int_t * vOldPPis )
{
    int fVerbose = 0;
    Vec_Int_t * vNewPPis, * vFanins;
    Gia_Obj_t * pObj, * pFanin;
    int i, k, RetValue, Counters[3] = {0};

    // (0) make sure fanin counters are 0 at the beginning
//    Gia_ManForEachObj( p->pGia, pObj, i )
//        assert( Rnm_ObjCount(p, pObj) == 0 );

    // (1) increment PPI fanin counters
    Vec_IntClear( p->vFanins );
    Gia_ManForEachObjVec( vOldPPis, p->pGia, pObj, i )
    {
        vFanins = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vFanins, p->pGia, pFanin, k )
            if ( Rnm_ObjAddToCount(p, pFanin) == 0 ) // fanin counter is 0 -- save it
                Vec_IntPush( p->vFanins, Gia_ObjId(p->pGia, pFanin) );
    }

    // (3) select objects with reconvergence, which create potential constraints
    // - flop objects
    // - objects whose fanin belongs to the justified area
    // - objects whose fanins overlap
    // (these do not guantee reconvergence, but may potentially have it)
    // (other objects cannot have reconvergence, even if they are added)
    vNewPPis = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vOldPPis, p->pGia, pObj, i )
    {
        if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( fVerbose )
                Counters[0]++;
            Vec_IntPush( vNewPPis, Gia_ObjId(p->pGia, pObj) );
            continue;
        }
        vFanins = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vFanins, p->pGia, pFanin, k )
        {
            if ( Rnm_ObjIsJust(p, pFanin) || Rnm_ObjCount(p, pFanin) > 1 )
            {
                if ( fVerbose )
                    Counters[1] += Rnm_ObjIsJust(p, pFanin);
                if ( fVerbose )
                    Counters[2] += (Rnm_ObjCount(p, pFanin) > 1);
                Vec_IntPush( vNewPPis, Gia_ObjId(p->pGia, pObj) );
                break;
            }
        }
    }
    RetValue = Vec_IntUniqify( vNewPPis );
    assert( RetValue == 0 );

    // (4) clear fanin counters
    // this is important for counters to be correctly set in the future iterations -- see step (0)
    Gia_ManForEachObjVec( p->vFanins, p->pGia, pObj, i )
        Rnm_ObjSetCount( p, pObj, 0 );

    // visualize
    if ( fVerbose )
        printf( "*** Refinement %3d : PI+PPI =%4d. Old =%4d. New =%4d.   FF =%4d. Just =%4d. Shared =%4d.\n", 
            p->nRefId, Vec_IntSize(p->vMap), Vec_IntSize(vOldPPis), Vec_IntSize(vNewPPis), Counters[0], Counters[1], Counters[2] );

//    Rnm_ManPrintSelected( p, vNewPPis );
//    Ga2_StructAnalize( p->pGia, p->vMap, p->vObjs, vNewPPis );
    return vNewPPis;
}